

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddMisc.c
# Opt level: O0

int cuddZddDagInt(DdNode *n,st__table *tab)

{
  int iVar1;
  int iVar2;
  st__table *tab_local;
  DdNode *n_local;
  
  if (n == (DdNode *)0x0) {
    n_local._4_4_ = 0;
  }
  else {
    iVar1 = st__lookup(tab,(char *)n,(char **)0x0);
    if (iVar1 == 1) {
      n_local._4_4_ = 0;
    }
    else if (*(int *)((ulong)n & 0xfffffffffffffffe) == 0x7fffffff) {
      n_local._4_4_ = 0;
    }
    else {
      st__insert(tab,(char *)n,(char *)0x0);
      iVar1 = cuddZddDagInt((n->type).kids.T,tab);
      iVar2 = cuddZddDagInt((n->type).kids.E,tab);
      n_local._4_4_ = iVar1 + 1 + iVar2;
    }
  }
  return n_local._4_4_;
}

Assistant:

static int
cuddZddDagInt(
  DdNode * n,
  st__table * tab)
{
    if (n == NIL(DdNode))
        return(0);

    if ( st__is_member(tab, (char *)n) == 1)
        return(0);

    if (Cudd_IsConstant(n))
        return(0);

    (void) st__insert(tab, (char *)n, NIL(char));
    return(1 + cuddZddDagInt(cuddT(n), tab) +
        cuddZddDagInt(cuddE(n), tab));

}